

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int selectWindowRewriteSelectCb(Walker *pWalker,Select *pSelect)

{
  WindowRewrite *pWVar1;
  Select *pSVar2;
  
  pWVar1 = (pWalker->u).pRewrite;
  pSVar2 = pWVar1->pSubSelect;
  if (pSVar2 != pSelect) {
    pWVar1->pSubSelect = pSelect;
    sqlite3WalkSelect(pWalker,pSelect);
    pWVar1->pSubSelect = pSVar2;
  }
  return (uint)(pSVar2 != pSelect);
}

Assistant:

static int selectWindowRewriteSelectCb(Walker *pWalker, Select *pSelect){
  struct WindowRewrite *p = pWalker->u.pRewrite;
  Select *pSave = p->pSubSelect;
  if( pSave==pSelect ){
    return WRC_Continue;
  }else{
    p->pSubSelect = pSelect;
    sqlite3WalkSelect(pWalker, pSelect);
    p->pSubSelect = pSave;
  }
  return WRC_Prune;
}